

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

int __thiscall
mp::internal::
NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
::ReadOpCode(NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
             *this)

{
  uint uVar1;
  ulong local_38 [3];
  ArgList local_20;
  
  uVar1 = TextReader<fmt::Locale>::ReadUInt<int>(this->reader_);
  if (0x52 < (int)uVar1) {
    local_38[0] = (ulong)uVar1;
    local_20.types_ = 2;
    local_20.field_1.values_ = (Value *)local_38;
    TextReader<fmt::Locale>::DoReportError
              (this->reader_,(this->reader_->super_ReaderBase).token_,(CStringRef)0x1725a8,&local_20
              );
  }
  TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
  return uVar1;
}

Assistant:

int ReadOpCode() {
    int opcode = reader_.ReadUInt();
    if (opcode > internal::MAX_OPCODE)
      reader_.ReportError("invalid opcode {}", opcode);
    reader_.ReadTillEndOfLine();
    return opcode;
  }